

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void xmlListClear(xmlListPtr l)

{
  _xmlLink *p_Var1;
  xmlLinkPtr next;
  xmlLinkPtr lk;
  xmlListPtr l_local;
  
  if (l != (xmlListPtr)0x0) {
    next = l->sentinel->next;
    while (next != l->sentinel) {
      p_Var1 = next->next;
      xmlLinkDeallocator(l,next);
      next = p_Var1;
    }
  }
  return;
}

Assistant:

void
xmlListClear(xmlListPtr l)
{
    xmlLinkPtr  lk;

    if (l == NULL)
        return;
    lk = l->sentinel->next;
    while(lk != l->sentinel) {
        xmlLinkPtr next = lk->next;

        xmlLinkDeallocator(l, lk);
        lk = next;
    }
}